

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O0

void Parser_skipWhiteSpaces(Parser *xmlParser)

{
  char *pcVar1;
  bool bVar2;
  char *local_18;
  char *p;
  Parser *xmlParser_local;
  
  local_18 = xmlParser->curPtr;
  while( true ) {
    bVar2 = false;
    if (*local_18 != '\0') {
      pcVar1 = strchr(WHITESPACE,(int)*local_18);
      bVar2 = pcVar1 != (char *)0x0;
    }
    if (!bVar2) break;
    local_18 = local_18 + 1;
  }
  xmlParser->curPtr = local_18;
  return;
}

Assistant:

static void Parser_skipWhiteSpaces(
	/*! [in] The XML parser. */
	Parser *xmlParser)
{
	char *p = xmlParser->curPtr;
	while (*p && strchr(WHITESPACE, *p)) {
		++p;
	}
	xmlParser->curPtr = p;
}